

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_fwrite(Context *context,IntrinsicResult partialResult)

{
  size_t sVar1;
  char *__ptr;
  Value *this;
  Value fileWrapper;
  Value local_88;
  String local_78;
  String data;
  Value self;
  String local_48;
  Value local_38;
  Value local_28;
  
  MiniScript::String::String(&local_48,"self");
  MiniScript::Context::GetVar((Context *)&self,(String *)partialResult.rs,(LocalOnlyMode)&local_48);
  MiniScript::String::release(&local_48);
  MiniScript::String::String(&local_78,"data");
  MiniScript::Context::GetVar
            ((Context *)&fileWrapper,(String *)partialResult.rs,(LocalOnlyMode)&local_78);
  MiniScript::Value::ToString((Value *)&data,(Machine *)&fileWrapper);
  MiniScript::Value::~Value(&fileWrapper);
  MiniScript::String::release(&local_78);
  MiniScript::Value::Value(&local_88,&_handle);
  MiniScript::Value::Lookup(&fileWrapper,&self);
  MiniScript::Value::~Value(&local_88);
  if (fileWrapper.type == Handle) {
    if ((FILE *)fileWrapper.data.ref[1]._vptr_RefCountedStorage == (FILE *)0x0) {
      this = &local_28;
      MiniScript::Value::Value(this,(Value *)MiniScript::Value::zero);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,this,true);
    }
    else {
      if (data.ss == (StringStorage *)0x0) {
        __ptr = "";
        sVar1 = 0;
      }
      else {
        __ptr = (data.ss)->data;
        sVar1 = (data.ss)->dataSize - 1;
      }
      sVar1 = fwrite(__ptr,1,sVar1,(FILE *)fileWrapper.data.ref[1]._vptr_RefCountedStorage);
      local_38.data.number = (double)(int)sVar1;
      this = &local_38;
      local_38.type = Number;
      local_38.noInvoke = false;
      local_38.localOnly = Off;
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,this,true);
    }
    MiniScript::Value::~Value(this);
  }
  else {
    MiniScript::IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  }
  MiniScript::Value::~Value(&fileWrapper);
  MiniScript::String::release(&data);
  MiniScript::Value::~Value(&self);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_fwrite(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	String data = context->GetVar("data").ToString();

	Value fileWrapper = self.Lookup(_handle);
	if (fileWrapper.IsNull() or fileWrapper.type != ValueType::Handle) return IntrinsicResult::Null;
	FileHandleStorage *storage = (FileHandleStorage*)fileWrapper.data.ref;
	FILE *handle = storage->f;
	if (handle == nullptr) return IntrinsicResult(Value::zero);

	size_t written = fwrite(data.c_str(), 1, data.sizeB(), handle);
	return IntrinsicResult((int)written);
}